

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O3

Vector3f __thiscall cosineWeightedHemisphere::sample(cosineWeightedHemisphere *this,Ray *ray,Hit *h)

{
  int iVar1;
  long in_RCX;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  float fVar6;
  Vector3f VVar7;
  default_random_engine generator;
  Vector3f y;
  Vector3f x;
  Vector3f normal;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_90;
  Vector3f local_88;
  Vector3f local_7c;
  Vector3f local_70;
  Vector3f local_64;
  Vector3f local_58;
  Vector3f local_4c [2];
  Vector3f local_34;
  
  iVar1 = rand();
  local_90._M_x = (ulong)(long)iVar1 % 0x7fffffff + (ulong)((ulong)(long)iVar1 % 0x7fffffff == 0);
  fVar2 = std::
          generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    (&local_90);
  fVar2 = fVar2 + 0.0;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar3 = std::
          generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    (&local_90);
  Vector3f::Vector3f(&local_64,(Vector3f *)(in_RCX + 0x10));
  Vector3f::Vector3f(&local_88,1.0,2.0,3.0);
  Vector3f::cross(&local_88,&local_64);
  Vector3f::normalized(&local_7c);
  Vector3f::cross(&local_70,&local_64);
  Vector3f::normalized(&local_88);
  fVar6 = 1.0 - fVar2 * fVar2;
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  ::operator*(fVar2,&local_88);
  dVar4 = (double)((fVar3 + 0.0) * 6.2831855);
  dVar5 = sin(dVar4);
  ::operator*((float)dVar5,local_4c);
  dVar4 = cos(dVar4);
  ::operator*((float)dVar4,&local_58);
  operator+(local_4c,&local_58);
  ::operator*(fVar6,&local_34);
  VVar7 = operator+(&local_88,&local_34);
  return (Vector3f)VVar7.m_elements;
}

Assistant:

Vector3f cosineWeightedHemisphere::sample(const Ray &ray, Hit &h) const {
    std::default_random_engine generator(rand());
    std::uniform_real_distribution<float> uniform(0.f, 1.f);

    float r = sqrt(uniform(generator));
    float v = 2.f * (float)M_PI * uniform(generator);
    Vector3f normal = h.getNormal();

    // TODO: think of a better way to do this
    Vector3f x = Vector3f::cross(Vector3f(1., 2., 3.), normal).normalized();
    Vector3f y = Vector3f::cross(x, normal).normalized();

    float factor = sqrt(1-r*r);

    return r * normal + factor * (sin(v) * x + cos(v) * y);
}